

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_open_memory.c
# Opt level: O3

void test_write_open_memory(void)

{
  ulong v1;
  int iVar1;
  archive_entry *entry;
  char *pcVar2;
  archive *_a;
  int64_t iVar3;
  wchar_t line;
  int64_t v2;
  char *e2;
  ulong buffSize;
  size_t used;
  archive *extra;
  ulong local_38;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                   ,L'\'',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_pathname(entry,"/tmp/test");
  archive_entry_set_mode(entry,0x8000);
  pcVar2 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
             ,L'*',pcVar2,"archive_entry_pathname(ae)","/tmp/test","name",(void *)0x0,L'\0');
  buffSize = 100;
  do {
    _a = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                     ,L'2',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",_a);
    iVar1 = archive_write_set_bytes_in_last_block(_a,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'6',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_bytes_in_last_block(a, 1)",_a);
    iVar1 = archive_write_set_bytes_per_block(_a,0x5e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'8',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",_a);
    buff[buffSize] = 0xae;
    iVar1 = archive_write_open_memory(_a,buff,buffSize,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, i, &used)",_a);
    iVar1 = archive_write_header(_a,entry);
    if (buffSize < 0x1d6) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'?',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_header(a,ae)",_a);
      failure("buffer size=%d\n",buffSize & 0xffffffff);
LAB_001e3967:
      iVar1 = archive_write_close(_a);
      v2 = (int64_t)iVar1;
      line = L'H';
      iVar3 = -0x1e;
      pcVar2 = "ARCHIVE_FATAL";
      e2 = "archive_write_close(a)";
      extra = _a;
    }
    else {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
      failure("buffer size=%d\n",buffSize & 0xffffffff);
      if (buffSize < 0x600) goto LAB_001e3967;
      iVar1 = archive_write_close(_a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",_a);
      v1 = local_38;
      iVar3 = archive_filter_bytes(_a,-1);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                          ,L'K',v1,"used",iVar3,"archive_filter_bytes(a, -1)",(void *)0x0);
      iVar3 = archive_filter_bytes(_a,-1);
      v2 = archive_filter_bytes(_a,0);
      extra = (archive *)0x0;
      line = L'M';
      pcVar2 = "archive_filter_bytes(a, -1)";
      e2 = "archive_filter_bytes(a, 0)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,line,iVar3,pcVar2,v2,e2,extra);
    iVar1 = archive_write_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                        ,L'P',(ulong)buff[buffSize],"buff[i]",0xae,"0xAE",(void *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_open_memory.c"
                     ,L'Q',(uint)(local_38 <= buffSize),"used <= i",(void *)0x0);
    buffSize = buffSize + 1;
    if (buffSize == 0x640) {
      archive_entry_free(entry);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_write_open_memory)
{
	unsigned int i;
	struct archive *a;
	struct archive_entry *ae;
	const char *name="/tmp/test";

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, name);
	archive_entry_set_mode(ae, S_IFREG);
	assertEqualString(archive_entry_pathname(ae), name);

	/* Try writing with different buffer sizes. */
	/* Make sure that we get failure on too-small buffers, success on
	 * large enough ones. */
	for (i = 100; i < 1600; i++) {
		size_t used;
		size_t blocksize = 94;
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_ustar(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, 1));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		buff[i] = 0xAE;
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, i, &used));
		/* If buffer is smaller than a tar header, this should fail. */
		if (i < (511/blocksize)*blocksize)
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_write_header(a,ae));
		else
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_write_header(a, ae));
		/* If buffer is smaller than a tar header plus 1024 byte
		 * end-of-archive marker, then this should fail. */
		failure("buffer size=%d\n", (int)i);
		if (i < 1536)
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_write_close(a));
		else {
			assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
			assertEqualInt(used, archive_filter_bytes(a, -1));
			assertEqualInt(archive_filter_bytes(a, -1),
			    archive_filter_bytes(a, 0));
		}
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		assertEqualInt(buff[i], 0xAE);
		assert(used <= i);
	}
	archive_entry_free(ae);
}